

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

dgBigVector * __thiscall
dgMeshEffect::GetOrigin(dgBigVector *__return_storage_ptr__,dgMeshEffect *this)

{
  double *pdVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar2 = *(int *)&(this->super_dgRefCounter).field_0xc;
  if ((long)iVar2 < 1) {
    dVar8 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
  }
  else {
    dVar8 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    lVar6 = 0;
    do {
      pdVar1 = (double *)((long)&(this->m_points->super_dgTemplateVector<double>).m_x + lVar6);
      dVar8 = dVar8 + *pdVar1;
      dVar9 = dVar9 + pdVar1[1];
      dVar10 = dVar10 + *(double *)
                         ((long)&(this->m_points->super_dgTemplateVector<double>).m_z + lVar6);
      lVar6 = lVar6 + 0x20;
    } while ((long)iVar2 << 5 != lVar6);
  }
  dVar11 = 1.0 / (double)iVar2;
  auVar7._8_8_ = dVar9 * dVar11;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_x = dVar8 * dVar11;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_y = auVar7._8_8_;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_z = dVar10 * dVar11;
  (__return_storage_ptr__->super_dgTemplateVector<double>).m_w = 0.0;
  if ((long)ABS(dVar8 * dVar11) < 0x7ff0000000000000) {
    auVar7._0_8_ = dVar10 * dVar11;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar7 = vandpd_avx512vl(auVar7,auVar4);
    auVar5._8_8_ = 0x7fefffffffffffff;
    auVar5._0_8_ = 0x7fefffffffffffff;
    uVar3 = vpcmpgtq_avx512vl(auVar7,auVar5);
    if (((uVar3 & 3) >> 1 == 0) && ((uVar3 & 1) == 0)) {
      return __return_storage_ptr__;
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

dgBigVector dgMeshEffect::GetOrigin ()const
{
	dgBigVector origin (hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f), hacd::HaF64 (0.0f));	
	for (hacd::HaI32 i = 0; i < m_pointCount; i ++) {
		origin += m_points[i];
	}	
	return origin.Scale (hacd::HaF64 (1.0f) / m_pointCount);
}